

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O1

int __thiscall
QDirSortItemComparator::compareStrings
          (QDirSortItemComparator *this,QString *a,QString *b,CaseSensitivity cs)

{
  int iVar1;
  QStringView s1;
  QStringView s2;
  
  if (this->collator != (QCollator *)0x0) {
    s1.m_data = (a->d).ptr;
    s1.m_size = (a->d).size;
    s2.m_data = (b->d).ptr;
    s2.m_size = (b->d).size;
    iVar1 = QCollator::compare(this->collator,s1,s2);
    return iVar1;
  }
  iVar1 = QString::compare(a,b,cs);
  return iVar1;
}

Assistant:

int compareStrings(const QString &a, const QString &b, Qt::CaseSensitivity cs) const
    {
#ifndef QT_BOOTSTRAPPED
        if (collator)
            return collator->compare(a, b);
#endif
        return a.compare(b, cs);
    }